

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm.cpp
# Opt level: O1

void EBPLM::PredictVelOnZFace
               (Box *zebox,Array4<double> *Imz,Array4<double> *Ipz,Array4<const_double> *q,
               Array4<const_double> *ccvel,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  BCRec *bcrec;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  double *pdVar37;
  long lVar38;
  double *pdVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double *pdVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  double *pdVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  EBCellFlag *pEVar51;
  long lVar52;
  long lVar53;
  double *pdVar54;
  long lVar55;
  long lVar56;
  double *pdVar57;
  double *pdVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  double *pdVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  double *pdVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  undefined8 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  int iVar83;
  undefined1 auVar84 [16];
  pair<bool,_bool> pVar85;
  pair<bool,_bool> pVar86;
  pair<bool,_bool> pVar87;
  int lc;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  long lVar114;
  long lVar115;
  long lVar116;
  long lVar117;
  long lVar118;
  long lVar119;
  long lVar120;
  long lVar121;
  long lVar122;
  long lVar123;
  long lVar124;
  double **ppdVar125;
  double *pdVar126;
  int iVar127;
  uint uVar128;
  int iVar129;
  long lVar130;
  long lVar131;
  long lVar132;
  long lVar133;
  long lVar134;
  long lVar135;
  Long *pLVar136;
  int dir;
  int dir_00;
  uint uVar137;
  int iVar138;
  long lVar139;
  int iVar140;
  long lVar141;
  long lVar142;
  double *pdVar143;
  int iVar144;
  int iVar145;
  int iVar146;
  long lVar147;
  uint uVar148;
  long lVar149;
  long lVar150;
  long lVar151;
  double *pdVar152;
  char cVar153;
  uint uVar154;
  long lVar155;
  long lVar156;
  long lVar157;
  double *pdVar158;
  double *pdVar159;
  double *pdVar160;
  long lVar161;
  long lVar162;
  long lVar163;
  long lVar164;
  long lVar165;
  char cVar166;
  int iVar167;
  long lVar168;
  long lVar169;
  double *pdVar170;
  double *pdVar171;
  long lVar172;
  int iVar173;
  long lVar174;
  long lVar175;
  long lVar176;
  long lVar177;
  int iVar178;
  int iVar179;
  int iVar180;
  long lVar181;
  long lVar182;
  long lVar183;
  long lVar184;
  bool bVar185;
  ulong uVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  undefined1 auVar196 [16];
  double dVar197;
  ulong uVar198;
  double dVar199;
  double dVar200;
  undefined1 auVar201 [16];
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar216;
  undefined1 auVar215 [16];
  double dVar217;
  Real delta_x;
  Real delta_y;
  Real du [27];
  Real A [27] [3];
  double local_af8;
  double local_ad8;
  long local_ac0;
  double local_a88;
  long local_948;
  long local_940;
  double *local_938;
  long local_930;
  double *local_928;
  double *local_8a0;
  double *local_868;
  double *local_860;
  double *local_858;
  double *local_830;
  double *local_828;
  double *local_820;
  double *local_7a0;
  double *local_798;
  long local_778;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3e8;
  double dStack_3e0;
  double local_3c8;
  double adStack_3b8 [28];
  anon_class_680_18_41abcaaf local_2d8;
  
  dVar187 = dt / (geom->super_CoordSys).dx[2];
  iVar178 = (geom->domain).smallend.vect[0];
  iVar180 = (geom->domain).smallend.vect[1];
  iVar173 = (geom->domain).bigend.vect[0];
  iVar6 = (geom->domain).bigend.vect[1];
  iVar7 = (geom->domain).smallend.vect[2];
  iVar8 = (geom->domain).bigend.vect[2];
  bcrec = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  pVar85 = anon_unknown.dwarf_650683::has_extdir_or_ho(bcrec,0,iVar180);
  pVar86 = anon_unknown.dwarf_650683::has_extdir_or_ho(bcrec,1,dir);
  pVar87 = anon_unknown.dwarf_650683::has_extdir_or_ho(bcrec,2,dir_00);
  auVar84 = _DAT_006979c0;
  if (((((((ushort)pVar85 & 1) == 0) || (iVar178 < (zebox->smallend).vect[0] + -1)) &&
       ((((ushort)pVar85 >> 8 & 1) == 0 || ((zebox->bigend).vect[0] < iVar173)))) &&
      (((((ushort)pVar87 & 1) == 0 || (iVar7 < (zebox->smallend).vect[2] + -1)) &&
       ((((ushort)pVar87 >> 8 & 1) == 0 || ((zebox->bigend).vect[2] < iVar8)))))) &&
     (((((ushort)pVar86 & 1) == 0 || (iVar180 < (zebox->smallend).vect[1] + -1)) &&
      ((((ushort)pVar86 >> 8 & 1) == 0 || ((zebox->bigend).vect[1] < iVar6)))))) {
    iVar178 = (ccc->begin).y;
    iVar180 = (zebox->smallend).vect[1];
    lVar131 = (long)iVar180 + -1;
    lVar32 = ccc->jstride;
    lVar94 = (lVar131 - iVar178) * lVar32;
    iVar173 = (ccc->begin).z;
    iVar6 = (zebox->smallend).vect[2];
    lVar161 = (long)iVar6;
    lVar33 = ccc->kstride;
    lVar130 = (~(long)iVar173 + lVar161) * lVar33;
    lVar34 = ccc->nstride;
    iVar7 = (zebox->smallend).vect[0];
    lVar141 = (long)iVar7;
    iVar8 = (ccc->begin).x;
    lVar95 = (long)iVar8;
    iVar9 = (q->begin).x;
    lVar174 = (long)iVar9;
    iVar10 = (q->begin).y;
    lVar149 = (long)iVar10;
    lVar35 = q->jstride;
    iVar11 = (q->begin).z;
    lVar175 = (long)iVar11;
    lVar36 = q->kstride;
    pdVar37 = q->p;
    lVar38 = q->nstride;
    pdVar39 = ccvel->p;
    lVar40 = ccvel->jstride;
    lVar41 = ccvel->kstride;
    lVar42 = ccvel->nstride;
    lVar155 = (long)(ccvel->begin).x;
    iVar12 = (ccvel->begin).y;
    lVar156 = (long)(ccvel->begin).z;
    pdVar43 = Imz->p;
    lVar44 = Imz->jstride;
    lVar45 = Imz->kstride;
    lVar46 = Imz->nstride;
    iVar13 = (Imz->begin).x;
    iVar14 = (Imz->begin).y;
    iVar140 = (Imz->begin).z;
    pdVar47 = Ipz->p;
    lVar48 = Ipz->jstride;
    lVar49 = Ipz->kstride;
    lVar50 = Ipz->nstride;
    iVar15 = (Ipz->begin).x;
    iVar16 = (Ipz->begin).y;
    uVar17 = (Ipz->begin).z;
    pEVar51 = flag->p;
    lVar52 = flag->jstride;
    lVar53 = flag->kstride;
    iVar18 = (flag->begin).x;
    iVar19 = (flag->begin).y;
    lVar168 = (long)(flag->begin).z;
    pdVar54 = vfrac->p;
    lVar55 = vfrac->jstride;
    lVar56 = vfrac->kstride;
    uVar20 = (vfrac->begin).x;
    lVar169 = (long)(int)uVar20;
    uVar21 = (vfrac->begin).y;
    lVar96 = (long)(int)uVar21;
    iVar22 = (vfrac->begin).z;
    lVar176 = (long)iVar22;
    pdVar57 = ccc->p;
    pdVar58 = fcx->p;
    lVar59 = fcx->jstride;
    lVar60 = fcx->kstride;
    lVar61 = fcx->nstride;
    iVar23 = (fcx->begin).x;
    iVar24 = (fcx->begin).y;
    lVar181 = (long)(fcx->begin).z;
    pdVar62 = fcy->p;
    lVar63 = fcy->jstride;
    lVar64 = fcy->kstride;
    lVar65 = fcy->nstride;
    lVar182 = (long)(fcy->begin).x;
    iVar25 = (fcy->begin).y;
    lVar183 = (long)(fcy->begin).z;
    pdVar66 = fcz->p;
    lVar67 = fcz->jstride;
    lVar68 = fcz->kstride;
    lVar69 = fcz->nstride;
    lVar184 = (long)(fcz->begin).x;
    iVar26 = (fcz->begin).y;
    iVar27 = (fcz->begin).z;
    iVar28 = (zebox->bigend).vect[0];
    iVar29 = (zebox->bigend).vect[1];
    iVar30 = (zebox->bigend).vect[2];
    uVar154 = (iVar7 + -1) - iVar9;
    local_8a0 = pdVar37 + ((lVar141 +
                           (lVar131 - lVar149) * lVar35 + ((lVar161 - lVar175) + -2) * lVar36) -
                          lVar174);
    local_948 = 0;
    auVar215 = _DAT_006979b0;
    do {
      if (iVar6 <= iVar30) {
        lVar131 = local_948 * lVar38;
        local_938 = local_8a0;
        local_940 = lVar161;
        local_868 = pdVar57 + ((lVar141 + lVar94 + lVar130 + lVar34 * 2 + -1) - lVar95);
        local_860 = pdVar57 + ((lVar34 + lVar141 + lVar94 + lVar130 + -1) - lVar95);
        local_858 = pdVar57 + ((lVar141 + lVar94 + lVar130 + -1) - lVar95);
        do {
          if (iVar180 <= iVar29) {
            lVar2 = local_940 + -1;
            lVar3 = local_940 + -2;
            lVar4 = local_940 + 1;
            lVar97 = (local_940 - lVar176) * lVar56;
            lVar98 = (lVar2 - lVar176) * lVar56;
            lVar99 = (lVar3 - lVar176) * lVar56;
            lVar100 = (lVar4 - lVar176) * lVar56;
            lVar101 = (local_940 - lVar175) * lVar36;
            lVar102 = (local_940 - lVar156) * lVar41;
            lVar103 = (lVar2 - lVar175) * lVar36;
            lVar104 = (lVar4 - lVar175) * lVar36;
            lVar105 = (lVar3 - lVar175) * lVar36;
            lVar106 = (local_940 - iVar27) * lVar68;
            lVar107 = (local_940 - iVar173) * lVar33;
            iVar127 = (int)local_940;
            iVar88 = iVar127 - iVar11;
            lVar108 = iVar88 * lVar36;
            lVar109 = (local_940 - lVar183) * lVar64;
            lVar110 = (local_940 - lVar181) * lVar60;
            lVar132 = (lVar2 - lVar156) * lVar41;
            lVar133 = ((int)lVar3 - iVar11) * lVar36;
            iVar89 = (int)lVar2 - iVar173;
            iVar90 = (int)lVar2 - iVar11;
            lVar111 = iVar90 * lVar36;
            lVar112 = (lVar2 - lVar183) * lVar64;
            lVar113 = (lVar2 - lVar181) * lVar60;
            local_928 = local_938;
            local_820 = local_858;
            local_828 = local_860;
            local_830 = local_868;
            local_930 = (long)iVar180;
            do {
              if (iVar7 <= iVar28) {
                lVar114 = (local_930 - iVar19) * lVar52;
                lVar115 = (local_930 - lVar96) * lVar55;
                lVar116 = (local_930 - lVar149) * lVar35;
                lVar117 = (local_930 - iVar12) * lVar40;
                lVar118 = (local_930 - iVar26) * lVar67;
                lVar119 = (local_930 - iVar178) * lVar32;
                iVar167 = (int)local_930;
                iVar91 = iVar167 - iVar10;
                lVar120 = iVar91 * lVar35;
                lVar121 = ((local_930 + -1) - lVar96) * lVar55;
                lVar150 = ((local_930 + 1) - lVar96) * lVar55;
                lVar139 = ((local_930 + -1) - lVar149) * lVar35;
                lVar147 = ((local_930 + 1) - lVar149) * lVar35;
                lVar151 = ((iVar167 + 1) - iVar25) * lVar63;
                lVar157 = (local_930 - iVar25) * lVar63;
                lVar162 = (local_930 - iVar24) * lVar59;
                lVar142 = (int)(iVar167 + ~uVar21) * lVar55;
                lVar172 = (int)((iVar167 + 1) - uVar21) * lVar55;
                local_798 = local_828;
                local_7a0 = local_830;
                pdVar152 = local_928;
                pdVar158 = local_820;
                lVar165 = lVar141;
                local_ac0 = (ulong)uVar154 << 0x20;
                local_778 = (lVar141 << 0x20) - (lVar174 << 0x20);
                uVar5 = uVar154;
                iVar83 = (iVar7 + -1) - iVar8;
                iVar145 = iVar7 - iVar9;
                do {
                  lVar122 = lVar165 - iVar18;
                  uVar31 = pEVar51[lVar114 + lVar122 + (local_940 - lVar168) * lVar53].flag;
                  dVar188 = 0.0;
                  dVar192 = 0.0;
                  if ((uVar31 >> 9 & 1) != 0) {
                    lVar134 = lVar165 - lVar169;
                    dVar208 = pdVar54[lVar115 + lVar134 + lVar97];
                    iVar92 = (int)lVar165;
                    if ((((dVar208 != 1.0) || (NAN(dVar208))) ||
                        (pdVar54[lVar115 + lVar134 + lVar98] != 1.0)) ||
                       (NAN(pdVar54[lVar115 + lVar134 + lVar98]))) {
LAB_00332c6a:
                      lVar123 = lVar165 - lVar184;
                      dVar192 = pdVar66[lVar118 + lVar123 + lVar106];
                      dVar191 = (pdVar66 + lVar118 + lVar123 + lVar106)[lVar69];
                      lVar124 = lVar165 - lVar95;
                      dVar200 = pdVar57[lVar107 + lVar119 + lVar124 + lVar34 * 2];
                      dVar199 = pdVar57[lVar107 + lVar119 + lVar124];
                      dVar193 = pdVar57[lVar107 + lVar119 + lVar124 + lVar34];
                      lVar163 = lVar165 - lVar174;
                      dVar203 = pdVar37[lVar120 + lVar163 + lVar108 + lVar131];
                      dVar213 = pdVar37[lVar120 + lVar163 + lVar103 + lVar131];
                      lVar135 = -1;
                      cVar153 = '\x05';
                      lVar177 = 0;
                      pdVar126 = local_798;
                      pdVar159 = pdVar158;
                      pdVar170 = local_7a0;
                      do {
                        lVar164 = -1;
                        pdVar143 = pdVar126;
                        pdVar160 = pdVar159;
                        pdVar171 = pdVar170;
                        cVar166 = cVar153;
                        do {
                          iVar138 = (int)lVar177;
                          ppdVar125 = &local_2d8.q.p + (long)iVar138 * 3;
                          lVar177 = 0;
                          do {
                            if (((int)lVar177 == 1 && ((int)lVar164 == 0 && (int)lVar135 == 0)) ||
                               ((1 << (cVar166 + (char)lVar177 & 0x1fU) & uVar31) == 0)) {
                              *ppdVar125 = (double *)0x0;
                              ppdVar125[1] = (double *)0x0;
                              ppdVar125[2] = (double *)0x0;
                            }
                            else {
                              dVar188 = pdVar143[lVar177];
                              *ppdVar125 = (double *)
                                           ((pdVar160[lVar177] + (double)((int)lVar177 + -1)) -
                                           dVar199);
                              ppdVar125[1] = (double *)((dVar188 + (double)(int)lVar164) - dVar193);
                              ppdVar125[2] = (double *)
                                             ((pdVar171[lVar177] + (double)(int)lVar135) -
                                             pdVar57[lVar107 + lVar119 + lVar124 + lVar34 * 2]);
                            }
                            lVar177 = lVar177 + 1;
                            ppdVar125 = ppdVar125 + 3;
                          } while (lVar177 != 3);
                          lVar164 = lVar164 + 1;
                          pdVar171 = pdVar171 + lVar32;
                          pdVar143 = pdVar143 + lVar32;
                          pdVar160 = pdVar160 + lVar32;
                          cVar166 = cVar166 + '\x03';
                          lVar177 = (long)iVar138 + 3;
                        } while (lVar164 != 2);
                        lVar135 = lVar135 + 1;
                        pdVar170 = pdVar170 + lVar33;
                        pdVar126 = pdVar126 + lVar33;
                        pdVar159 = pdVar159 + lVar33;
                        cVar153 = cVar153 + '\t';
                        lVar177 = (long)iVar138 + 3;
                      } while (lVar135 != 2);
                      lVar124 = -1;
                      cVar153 = '\x05';
                      lVar135 = 0;
                      do {
                        lVar177 = -1;
                        cVar166 = cVar153;
                        do {
                          iVar138 = (int)lVar135;
                          lVar164 = 0;
                          lVar135 = local_ac0;
                          do {
                            dVar188 = 0.0;
                            if (((int)lVar164 != 1 || ((int)lVar177 != 0 || (int)lVar124 != 0)) &&
                               ((1 << (cVar166 + (char)lVar164 & 0x1fU) & uVar31) != 0)) {
                              dVar188 = *(double *)
                                         ((long)pdVar37 +
                                         (lVar135 >> 0x1d) +
                                         (iVar91 + (int)lVar177) * lVar35 * 8 +
                                         (iVar88 + (int)lVar124) * lVar36 * 8 + lVar131 * 8) -
                                        dVar203;
                            }
                            adStack_3b8[iVar138 + lVar164] = dVar188;
                            lVar164 = lVar164 + 1;
                            lVar135 = lVar135 + 0x100000000;
                          } while (lVar164 != 3);
                          lVar177 = lVar177 + 1;
                          cVar166 = cVar166 + '\x03';
                          lVar135 = (long)iVar138 + 3;
                        } while (lVar177 != 2);
                        lVar124 = lVar124 + 1;
                        cVar153 = cVar153 + '\t';
                        lVar135 = (long)iVar138 + 3;
                      } while (lVar124 != 2);
                      pdVar126 = &local_408;
                      lVar124 = 0;
                      do {
                        lVar135 = 0;
                        auVar201 = auVar215;
                        do {
                          auVar196 = auVar201 ^ auVar84;
                          if (auVar196._4_4_ == -0x80000000 && auVar196._0_4_ < -0x7ffffffd) {
                            *(undefined8 *)((long)pdVar126 + lVar135) = 0;
                            *(undefined8 *)((long)pdVar126 + lVar135 + 0x18) = 0;
                          }
                          lVar177 = auVar201._8_8_;
                          auVar201._0_8_ = auVar201._0_8_ + 2;
                          auVar201._8_8_ = lVar177 + 2;
                          lVar135 = lVar135 + 0x30;
                        } while (lVar135 != 0x60);
                        lVar124 = lVar124 + 1;
                        pdVar126 = pdVar126 + 1;
                      } while (lVar124 != 3);
                      dVar197 = 0.0;
                      dVar216 = 0.0;
                      dVar217 = 0.0;
                      pLVar136 = &local_2d8.q.kstride;
                      lVar124 = 0;
                      dVar188 = local_3f8;
                      dVar206 = local_3c8;
                      dVar195 = local_408;
                      dVar214 = local_400;
                      dVar211 = local_3e8;
                      dVar212 = dStack_3e0;
                      do {
                        dVar189 = (double)*pLVar136;
                        pdVar126 = ((Array4<const_double> *)(pLVar136 + -2))->p;
                        dVar210 = (double)pLVar136[-1];
                        dVar211 = dVar211 + dVar210 * (double)pLVar136[-1];
                        dVar212 = dVar212 + dVar210 * (double)*pLVar136;
                        dVar206 = dVar206 + dVar189 * dVar189;
                        dVar207 = adStack_3b8[lVar124];
                        dVar195 = dVar195 + (double)pdVar126 * (double)pdVar126;
                        dVar197 = dVar197 + dVar207 * (double)pdVar126;
                        dVar214 = dVar214 + dVar210 * (double)pdVar126;
                        dVar216 = dVar216 + dVar207 * dVar210;
                        dVar188 = dVar188 + dVar189 * (double)pdVar126;
                        dVar217 = dVar217 + dVar207 * dVar189;
                        lVar124 = lVar124 + 1;
                        pLVar136 = pLVar136 + 3;
                      } while (lVar124 != 0x1b);
                      dVar189 = dVar211 * dVar206 - dVar212 * dVar212;
                      dVar207 = dVar206 * dVar214 - dVar188 * dVar212;
                      dVar210 = dVar206 * dVar216 - dVar217 * dVar212;
                      dVar206 = dVar214 * dVar212 - dVar211 * dVar188;
                      local_ad8 = dVar188 * dVar206 + (dVar189 * dVar195 - dVar214 * dVar207);
                      local_a88 = (dVar188 * (dVar216 * dVar212 - dVar211 * dVar217) +
                                  (dVar189 * dVar197 - dVar214 * dVar210)) / local_ad8;
                      if ((dVar208 == 1.0) && (!NAN(dVar208))) {
                        if ((pdVar54[lVar115 + lVar97 + ((lVar165 + -1) - lVar169)] == 1.0) &&
                           (!NAN(pdVar54[lVar115 + lVar97 + ((lVar165 + -1) - lVar169)]))) {
                          if ((pdVar54[lVar115 + lVar97 + ((lVar165 + 1) - lVar169)] == 1.0) &&
                             (!NAN(pdVar54[lVar115 + lVar97 + ((lVar165 + 1) - lVar169)]))) {
                            dVar190 = dVar203 - pdVar37[lVar120 + lVar108 + lVar131 + ((lVar165 + -1
                                                                                       ) - lVar174)]
                            ;
                            dVar194 = pdVar37[lVar120 + lVar108 + lVar131 + ((lVar165 + 1) - lVar174
                                                                            )] - dVar203;
                            dVar190 = dVar190 + dVar190;
                            dVar194 = dVar194 + dVar194;
                            dVar189 = (pdVar37[lVar120 + lVar108 + lVar131 + ((lVar165 + 1) -
                                                                             lVar174)] -
                                      pdVar37[lVar120 + lVar108 + lVar131 + ((lVar165 + -1) -
                                                                            lVar174)]) * 0.5;
                            dVar204 = ABS(dVar190);
                            uVar186 = -(ulong)(0.0 < dVar189);
                            dVar189 = ABS(dVar189);
                            dVar205 = ABS(dVar194);
                            if (dVar204 <= dVar189) {
                              dVar189 = dVar204;
                            }
                            if (dVar189 <= dVar205) {
                              dVar205 = dVar189;
                            }
                            uVar198 = -(ulong)(0.0 < dVar190 * dVar194) & (ulong)dVar205;
                            local_a88 = (double)(~uVar186 & (uVar198 ^ 0x8000000000000000) |
                                                uVar186 & uVar198);
                          }
                        }
                      }
                      dVar189 = dVar214 * dVar217 - dVar188 * dVar216;
                      local_af8 = (dVar188 * dVar189 + (dVar210 * dVar195 - dVar207 * dVar197)) /
                                  local_ad8;
                      if ((((dVar208 == 1.0) && (!NAN(dVar208))) &&
                          (pdVar54[lVar121 + lVar97 + lVar134] == 1.0)) &&
                         (((!NAN(pdVar54[lVar121 + lVar97 + lVar134]) &&
                           (pdVar54[lVar150 + lVar97 + lVar134] == 1.0)) &&
                          (!NAN(pdVar54[lVar150 + lVar97 + lVar134]))))) {
                        dVar205 = dVar203 - pdVar37[lVar139 + lVar108 + lVar131 + lVar163];
                        dVar190 = pdVar37[lVar147 + lVar108 + lVar131 + lVar163] - dVar203;
                        dVar205 = dVar205 + dVar205;
                        dVar190 = dVar190 + dVar190;
                        dVar188 = (pdVar37[lVar147 + lVar108 + lVar131 + lVar163] -
                                  pdVar37[lVar139 + lVar108 + lVar131 + lVar163]) * 0.5;
                        dVar210 = ABS(dVar205);
                        uVar186 = -(ulong)(0.0 < dVar188);
                        dVar188 = ABS(dVar188);
                        dVar207 = ABS(dVar190);
                        if (dVar210 <= dVar188) {
                          dVar188 = dVar210;
                        }
                        if (dVar188 <= dVar207) {
                          dVar207 = dVar188;
                        }
                        uVar198 = -(ulong)(0.0 < dVar205 * dVar190) & (ulong)dVar207;
                        local_af8 = (double)(~uVar186 & (uVar198 ^ 0x8000000000000000) |
                                            uVar186 & uVar198);
                      }
                      local_ad8 = (dVar197 * dVar206 +
                                  (dVar195 * (dVar211 * dVar217 - dVar212 * dVar216) -
                                  dVar189 * dVar214)) / local_ad8;
                      if (((dVar208 == 1.0) && (!NAN(dVar208))) &&
                         ((pdVar54[lVar115 + lVar134 + lVar98] == 1.0 &&
                          (((!NAN(pdVar54[lVar115 + lVar134 + lVar98]) &&
                            (pdVar54[lVar115 + lVar134 + lVar100] == 1.0)) &&
                           (!NAN(pdVar54[lVar115 + lVar134 + lVar100]))))))) {
                        dVar214 = pdVar37[lVar120 + lVar163 + lVar104 + lVar131] - dVar203;
                        dVar195 = (dVar203 - dVar213) + (dVar203 - dVar213);
                        dVar214 = dVar214 + dVar214;
                        dVar188 = (pdVar37[lVar120 + lVar163 + lVar104 + lVar131] - dVar213) * 0.5;
                        dVar211 = ABS(dVar195);
                        uVar186 = -(ulong)(0.0 < dVar188);
                        dVar188 = ABS(dVar188);
                        dVar206 = ABS(dVar214);
                        if (dVar211 <= dVar188) {
                          dVar188 = dVar211;
                        }
                        if (dVar188 <= dVar206) {
                          dVar206 = dVar188;
                        }
                        uVar198 = -(ulong)(0.0 < dVar195 * dVar214) & (ulong)dVar206;
                        local_ad8 = (double)(~uVar186 & (uVar198 ^ 0x8000000000000000) |
                                            uVar186 & uVar198);
                      }
                      dVar188 = dVar213;
                      if (dVar203 <= dVar213) {
                        dVar188 = dVar203;
                      }
                      dVar191 = dVar191 - dVar193;
                      if (dVar213 <= dVar203) {
                        dVar213 = dVar203;
                      }
                      dVar192 = dVar192 - dVar199;
                      iVar93 = 0;
                      iVar138 = 0;
                      iVar146 = 0;
                      iVar144 = 0;
                      uVar137 = 0xffffffff;
                      do {
                        uVar128 = uVar137 + 1;
                        uVar148 = 0xffffffff;
                        iVar179 = iVar93;
                        do {
                          uVar1 = uVar148 + 1;
                          iVar129 = 5;
                          do {
                            if (((uVar31 >> (iVar179 + iVar129 & 0x1fU) & 1) != 0) &&
                               ((iVar129 != 6 || uVar148 != 0) || uVar137 != 0)) {
                              iVar138 = iVar138 + (uint)((iVar129 - 5U & 0xfffffffd) == 0 &&
                                                        (uVar148 == 0 && uVar137 == 0));
                              iVar146 = iVar146 + (uint)((iVar129 == 6 && uVar137 == 0) &&
                                                        (uVar1 & 0xfffffffd) == 0);
                              iVar144 = iVar144 + (uint)((iVar129 == 6 && uVar148 == 0) &&
                                                        (uVar128 & 0xfffffffd) == 0);
                            }
                            iVar129 = iVar129 + 1;
                          } while (iVar129 != 8);
                          iVar179 = iVar179 + 3;
                          uVar148 = uVar1;
                        } while (uVar1 != 2);
                        iVar93 = iVar93 + 9;
                        uVar137 = uVar128;
                      } while (uVar128 != 2);
                      dVar206 = 2.0;
                      if ((uVar31 >> 0x15 & 1) != 0) {
                        lVar124 = -1;
                        cVar153 = '\b';
                        dVar195 = dVar203;
                        dVar206 = dVar203;
                        do {
                          lVar135 = 0;
                          cVar166 = cVar153;
                          do {
                            lVar177 = -1;
                            lVar163 = local_ac0;
                            dVar214 = dVar206;
                            do {
                              dVar206 = dVar214;
                              if ((((int)lVar135 != 0 || (int)lVar124 != 0) || (int)lVar177 != 0) &&
                                 ((1 << (cVar166 + (char)lVar177 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar211 = *(double *)
                                           ((long)pdVar37 +
                                           (lVar163 >> 0x1d) +
                                           (iVar91 + (int)lVar135) * lVar35 * 8 +
                                           (iVar88 + (int)lVar124) * lVar36 * 8 + lVar131 * 8);
                                dVar206 = dVar211;
                                if (dVar211 <= dVar214) {
                                  dVar206 = dVar214;
                                }
                                if (dVar211 < dVar195) {
                                  dVar195 = dVar211;
                                }
                              }
                              lVar177 = lVar177 + 1;
                              lVar163 = lVar163 + 0x100000000;
                              dVar214 = dVar206;
                            } while (lVar177 != 2);
                            cVar166 = cVar166 + '\x03';
                            bVar185 = lVar135 == 0;
                            lVar135 = lVar135 + 1;
                          } while (bVar185);
                          lVar124 = lVar124 + 1;
                          cVar153 = cVar153 + '\t';
                        } while (lVar124 != 2);
                        dVar214 = (((pdVar62 + lVar151 + lVar109 + (lVar165 - lVar182))[lVar65] -
                                   dVar200) * local_ad8 +
                                  (0.5 - dVar193) * local_af8 +
                                  (pdVar62[lVar151 + lVar109 + (lVar165 - lVar182)] - dVar199) *
                                  local_a88 + dVar203) - dVar203;
                        if (dVar214 <= 1e-13) {
                          dVar206 = 1.0;
                          if ((dVar214 < -1e-13) &&
                             (dVar206 = (dVar195 - dVar203) / dVar214, 1.0 <= dVar206)) {
                            dVar206 = 1.0;
                          }
                        }
                        else {
                          dVar206 = (dVar206 - dVar203) / dVar214;
                          if (1.0 <= dVar206) {
                            dVar206 = 1.0;
                          }
                        }
                        if (2.0 <= dVar206) {
                          dVar206 = 2.0;
                        }
                      }
                      dVar195 = dVar206;
                      if ((short)uVar31 < 0) {
                        lVar124 = -1;
                        cVar153 = '\x05';
                        dVar195 = dVar203;
                        dVar214 = dVar203;
                        do {
                          lVar135 = -1;
                          cVar166 = cVar153;
                          do {
                            lVar177 = -1;
                            lVar163 = local_ac0;
                            dVar211 = dVar195;
                            do {
                              dVar195 = dVar211;
                              if ((((int)lVar135 != 0 || (int)lVar124 != 0) || (int)lVar177 != 0) &&
                                 ((1 << (cVar166 + (char)lVar177 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar212 = *(double *)
                                           ((long)pdVar37 +
                                           (lVar163 >> 0x1d) +
                                           (iVar91 + (int)lVar135) * lVar35 * 8 +
                                           (iVar88 + (int)lVar124) * lVar36 * 8 + lVar131 * 8);
                                dVar195 = dVar212;
                                if (dVar212 <= dVar211) {
                                  dVar195 = dVar211;
                                }
                                if (dVar212 < dVar214) {
                                  dVar214 = dVar212;
                                }
                              }
                              lVar177 = lVar177 + 1;
                              lVar163 = lVar163 + 0x100000000;
                              dVar211 = dVar195;
                            } while (lVar177 != 2);
                            cVar166 = cVar166 + '\x03';
                            bVar185 = lVar135 != 0;
                            lVar135 = lVar135 + 1;
                          } while (bVar185);
                          lVar124 = lVar124 + 1;
                          cVar153 = cVar153 + '\t';
                        } while (lVar124 != 2);
                        dVar211 = (((pdVar62 + lVar157 + lVar109 + (lVar165 - lVar182))[lVar65] -
                                   dVar200) * local_ad8 +
                                  (((pdVar62[lVar157 + lVar109 + (lVar165 - lVar182)] - dVar199) *
                                    local_a88 + dVar203) - (dVar193 + 0.5) * local_af8)) - dVar203;
                        if (dVar211 <= 1e-13) {
                          dVar195 = 1.0;
                          if ((dVar211 < -1e-13) &&
                             (dVar195 = (dVar214 - dVar203) / dVar211, 1.0 <= dVar195)) {
                            dVar195 = 1.0;
                          }
                        }
                        else {
                          dVar195 = (dVar195 - dVar203) / dVar211;
                          if (1.0 <= dVar195) {
                            dVar195 = 1.0;
                          }
                        }
                        if (dVar206 <= dVar195) {
                          dVar195 = dVar206;
                        }
                      }
                      dVar206 = dVar195;
                      if ((uVar31 >> 0x13 & 1) != 0) {
                        lVar124 = -1;
                        cVar153 = '\x06';
                        dVar214 = dVar203;
                        dVar206 = dVar203;
                        do {
                          lVar135 = -1;
                          cVar166 = cVar153;
                          do {
                            lVar177 = 0;
                            lVar163 = local_778;
                            do {
                              if ((((int)lVar135 != 0 || (int)lVar124 != 0) || (int)lVar177 != 0) &&
                                 ((1 << (cVar166 + (char)lVar177 & 0x1fU) & uVar31) != 0)) {
                                dVar211 = *(double *)
                                           ((long)pdVar37 +
                                           (lVar163 >> 0x1d) +
                                           (iVar91 + (int)lVar135) * lVar35 * 8 +
                                           (iVar88 + (int)lVar124) * lVar36 * 8 + lVar131 * 8);
                                dVar212 = dVar211;
                                if (dVar211 <= dVar206) {
                                  dVar212 = dVar206;
                                }
                                dVar206 = dVar212;
                                if (dVar211 < dVar214) {
                                  dVar214 = dVar211;
                                }
                              }
                              lVar177 = lVar177 + 1;
                              lVar163 = lVar163 + 0x100000000;
                            } while (lVar177 == 1);
                            lVar135 = lVar135 + 1;
                            cVar166 = cVar166 + '\x03';
                          } while (lVar135 != 2);
                          lVar124 = lVar124 + 1;
                          cVar153 = cVar153 + '\t';
                        } while (lVar124 != 2);
                        dVar211 = (((pdVar58 + lVar162 + lVar110 + ((iVar92 - iVar23) + 1))[lVar61]
                                   - dVar200) * local_ad8 +
                                  (pdVar58[lVar162 + lVar110 + ((iVar92 - iVar23) + 1)] - dVar193) *
                                  local_af8 + (0.5 - dVar199) * local_a88 + dVar203) - dVar203;
                        if (dVar211 <= 1e-13) {
                          dVar206 = 1.0;
                          if ((dVar211 < -1e-13) &&
                             (dVar206 = (dVar214 - dVar203) / dVar211, 1.0 <= dVar206)) {
                            dVar206 = 1.0;
                          }
                        }
                        else {
                          dVar206 = (dVar206 - dVar203) / dVar211;
                          if (1.0 <= dVar206) {
                            dVar206 = 1.0;
                          }
                        }
                        if (dVar195 <= dVar206) {
                          dVar206 = dVar195;
                        }
                      }
                      dVar195 = dVar206;
                      if ((uVar31 >> 0x11 & 1) != 0) {
                        lVar124 = -1;
                        cVar153 = '\x05';
                        dVar214 = dVar203;
                        dVar195 = dVar203;
                        do {
                          lVar135 = -1;
                          cVar166 = cVar153;
                          do {
                            lVar177 = -1;
                            lVar163 = local_ac0;
                            do {
                              if ((((int)lVar135 != 0 || (int)lVar124 != 0) || (int)lVar177 != 0) &&
                                 ((1 << (cVar166 + (char)lVar177 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar211 = *(double *)
                                           ((long)pdVar37 +
                                           (lVar163 >> 0x1d) +
                                           (iVar91 + (int)lVar135) * lVar35 * 8 +
                                           (iVar88 + (int)lVar124) * lVar36 * 8 + lVar131 * 8);
                                dVar212 = dVar211;
                                if (dVar211 <= dVar195) {
                                  dVar212 = dVar195;
                                }
                                dVar195 = dVar212;
                                if (dVar211 < dVar214) {
                                  dVar214 = dVar211;
                                }
                              }
                              lVar177 = lVar177 + 1;
                              lVar163 = lVar163 + 0x100000000;
                            } while (lVar177 != 1);
                            lVar135 = lVar135 + 1;
                            cVar166 = cVar166 + '\x03';
                          } while (lVar135 != 2);
                          lVar124 = lVar124 + 1;
                          cVar153 = cVar153 + '\t';
                        } while (lVar124 != 2);
                        dVar211 = (((pdVar58 + lVar162 + lVar110 + (lVar165 - iVar23))[lVar61] -
                                   dVar200) * local_ad8 +
                                  (pdVar58[lVar162 + lVar110 + (lVar165 - iVar23)] - dVar193) *
                                  local_af8 + (dVar203 - (dVar199 + 0.5) * local_a88)) - dVar203;
                        if (dVar211 <= 1e-13) {
                          dVar195 = 1.0;
                          if ((dVar211 < -1e-13) &&
                             (dVar195 = (dVar214 - dVar203) / dVar211, 1.0 <= dVar195)) {
                            dVar195 = 1.0;
                          }
                        }
                        else {
                          dVar195 = (dVar195 - dVar203) / dVar211;
                          if (1.0 <= dVar195) {
                            dVar195 = 1.0;
                          }
                        }
                        if (dVar206 <= dVar195) {
                          dVar195 = dVar206;
                        }
                      }
                      dVar206 = dVar195;
                      if ((uVar31 >> 0x1b & 1) != 0) {
                        cVar153 = '\x0e';
                        lVar124 = 0;
                        dVar214 = dVar203;
                        dVar206 = dVar203;
                        do {
                          lVar135 = -1;
                          cVar166 = cVar153;
                          do {
                            lVar177 = -1;
                            lVar163 = local_ac0;
                            do {
                              if ((((int)lVar135 != 0 || (int)lVar124 != 0) || (int)lVar177 != 0) &&
                                 ((1 << (cVar166 + (char)lVar177 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar211 = *(double *)
                                           ((long)pdVar37 +
                                           (lVar163 >> 0x1d) +
                                           (iVar91 + (int)lVar135) * lVar35 * 8 +
                                           (iVar88 + (int)lVar124) * lVar36 * 8 + lVar131 * 8);
                                dVar212 = dVar211;
                                if (dVar211 <= dVar206) {
                                  dVar212 = dVar206;
                                }
                                dVar206 = dVar212;
                                if (dVar211 < dVar214) {
                                  dVar214 = dVar211;
                                }
                              }
                              lVar177 = lVar177 + 1;
                              lVar163 = lVar163 + 0x100000000;
                            } while (lVar177 != 2);
                            lVar135 = lVar135 + 1;
                            cVar166 = cVar166 + '\x03';
                          } while (lVar135 != 2);
                          cVar153 = cVar153 + '\t';
                          bVar185 = lVar124 == 0;
                          lVar124 = lVar124 + 1;
                        } while (bVar185);
                        dVar199 = ((0.5 - dVar200) * local_ad8 +
                                  ((pdVar66 + lVar118 + lVar123 + ((iVar127 + 1) - iVar27) * lVar68)
                                   [lVar69] - dVar193) * local_af8 +
                                  (pdVar66[lVar118 + lVar123 + ((iVar127 + 1) - iVar27) * lVar68] -
                                  dVar199) * local_a88 + dVar203) - dVar203;
                        if (dVar199 <= 1e-13) {
                          dVar206 = 1.0;
                          if ((dVar199 < -1e-13) &&
                             (dVar206 = (dVar214 - dVar203) / dVar199, 1.0 <= dVar206)) {
                            dVar206 = 1.0;
                          }
                        }
                        else {
                          dVar206 = (dVar206 - dVar203) / dVar199;
                          if (1.0 <= dVar206) {
                            dVar206 = 1.0;
                          }
                        }
                        if (dVar195 <= dVar206) {
                          dVar206 = dVar195;
                        }
                      }
                      cVar153 = '\x05';
                      lVar123 = -1;
                      dVar199 = dVar203;
                      dVar193 = dVar203;
                      do {
                        lVar124 = -1;
                        cVar166 = cVar153;
                        do {
                          lVar163 = -1;
                          lVar135 = local_ac0;
                          do {
                            if ((((int)lVar124 != 0 || (int)lVar123 != 0) || (int)lVar163 != 0) &&
                               ((1 << (cVar166 + (char)lVar163 + 1U & 0x1f) & uVar31) != 0)) {
                              dVar195 = *(double *)
                                         ((long)pdVar37 +
                                         (lVar135 >> 0x1d) +
                                         (iVar91 + (int)lVar124) * lVar35 * 8 +
                                         (iVar88 + (int)lVar123) * lVar36 * 8 + lVar131 * 8);
                              dVar214 = dVar195;
                              if (dVar195 <= dVar193) {
                                dVar214 = dVar193;
                              }
                              dVar193 = dVar214;
                              if (dVar195 < dVar199) {
                                dVar199 = dVar195;
                              }
                            }
                            lVar163 = lVar163 + 1;
                            lVar135 = lVar135 + 0x100000000;
                          } while (lVar163 != 2);
                          lVar124 = lVar124 + 1;
                          cVar166 = cVar166 + '\x03';
                        } while (lVar124 != 2);
                        cVar153 = cVar153 + '\t';
                        bVar185 = lVar123 != 0;
                        lVar123 = lVar123 + 1;
                      } while (bVar185);
                      dVar195 = ((dVar191 * local_af8 + dVar192 * local_a88 + dVar203) -
                                (dVar200 + 0.5) * local_ad8) - dVar203;
                      if (dVar195 <= 1e-13) {
                        dVar193 = 1.0;
                        if ((dVar195 < -1e-13) &&
                           (dVar193 = (dVar199 - dVar203) / dVar195, 1.0 <= dVar193)) {
                          dVar193 = 1.0;
                        }
                      }
                      else {
                        dVar193 = (dVar193 - dVar203) / dVar195;
                        if (1.0 <= dVar193) {
                          dVar193 = 1.0;
                        }
                      }
                      if (dVar206 <= dVar193) {
                        dVar193 = dVar206;
                      }
                      dVar199 = 0.0;
                      if (1 < iVar138) {
                        dVar199 = dVar193;
                      }
                      dVar206 = 0.0;
                      if (1 < iVar146) {
                        dVar206 = dVar193;
                      }
                      dVar195 = 0.0;
                      if (1 < iVar144) {
                        dVar195 = dVar193;
                      }
                      if (((((dVar208 == 1.0) && (!NAN(dVar208))) &&
                           (pdVar54[lVar115 + lVar97 + (int)(~uVar20 + iVar92)] == 1.0)) &&
                          ((!NAN(pdVar54[lVar115 + lVar97 + (int)(~uVar20 + iVar92)]) &&
                           (pdVar54[lVar115 + lVar97 + (int)((iVar92 - uVar20) + 1)] == 1.0)))) &&
                         (!NAN(pdVar54[lVar115 + lVar97 + (int)((iVar92 - uVar20) + 1)]))) {
                        dVar199 = 1.0;
                      }
                      if (((dVar208 == 1.0) && (!NAN(dVar208))) &&
                         ((pdVar54[lVar142 + lVar97 + lVar134] == 1.0 &&
                          (((!NAN(pdVar54[lVar142 + lVar97 + lVar134]) &&
                            (pdVar54[lVar172 + lVar97 + lVar134] == 1.0)) &&
                           (!NAN(pdVar54[lVar172 + lVar97 + lVar134]))))))) {
                        dVar206 = 1.0;
                      }
                      if (((dVar208 == 1.0) && (!NAN(dVar208))) &&
                         (((pdVar54[lVar115 + lVar134 + lVar98] == 1.0 &&
                           ((!NAN(pdVar54[lVar115 + lVar134 + lVar98]) &&
                            (pdVar54[lVar115 + lVar134 + ((iVar127 + 1) - iVar22) * lVar56] == 1.0))
                           )) && (!NAN(pdVar54[lVar115 + lVar134 + ((iVar127 + 1) - iVar22) * lVar56
                                              ]))))) {
                        dVar195 = 1.0;
                      }
                      dVar192 = (-0.5 - dVar200) * local_ad8 * dVar195 +
                                dVar191 * local_af8 * dVar206 +
                                dVar192 * local_a88 * dVar199 + dVar203;
                      if (dVar192 <= dVar213) {
                        dVar213 = dVar192;
                      }
                      if (dVar188 <= dVar213) {
                        dVar188 = dVar213;
                      }
                      dVar188 = pdVar39[lVar117 + lVar102 + lVar42 * 2 + (lVar165 - lVar155)] *
                                dVar187 * -0.5 * local_ad8 * dVar195 + dVar188;
                      auVar215 = _DAT_006979b0;
                    }
                    else if (((pdVar54[lVar115 + lVar134 + lVar99] != 1.0) ||
                             (NAN(pdVar54[lVar115 + lVar134 + lVar99]))) ||
                            (((pdVar54[lVar115 + lVar134 + lVar100] != 1.0 ||
                              ((NAN(pdVar54[lVar115 + lVar134 + lVar100]) ||
                               (pdVar54[lVar115 + lVar134 + ((local_940 + 2) - lVar176) * lVar56] !=
                                1.0)))) ||
                             (NAN(pdVar54[lVar115 + lVar134 + ((local_940 + 2) - lVar176) * lVar56])
                             )))) {
                      if ((pdVar54[lVar115 + lVar134 + lVar100] != 1.0) ||
                         (NAN(pdVar54[lVar115 + lVar134 + lVar100]))) goto LAB_00332c6a;
                      lVar123 = lVar165 - lVar174;
                      dVar188 = pdVar37[lVar116 + lVar123 + lVar101 + lVar131];
                      dVar199 = dVar188 - pdVar37[lVar116 + lVar123 + lVar103 + lVar131];
                      dVar193 = pdVar37[lVar116 + lVar123 + lVar104 + lVar131] - dVar188;
                      dVar199 = dVar199 + dVar199;
                      dVar193 = dVar193 + dVar193;
                      dVar192 = (pdVar37[lVar116 + lVar123 + lVar104 + lVar131] -
                                pdVar37[lVar116 + lVar123 + lVar103 + lVar131]) * 0.5;
                      dVar200 = ABS(dVar199);
                      uVar186 = -(ulong)(0.0 < dVar192);
                      dVar192 = ABS(dVar192);
                      dVar191 = ABS(dVar193);
                      if (dVar200 <= dVar192) {
                        dVar192 = dVar200;
                      }
                      if (dVar192 <= dVar191) {
                        dVar191 = dVar192;
                      }
                      uVar198 = -(ulong)(0.0 < dVar199 * dVar193) & (ulong)dVar191;
                      dVar188 = (double)(~uVar186 & (uVar198 ^ 0x8000000000000000) |
                                        uVar186 & uVar198) *
                                (-1.0 - pdVar39[lVar117 + lVar102 + lVar42 * 2 + (lVar165 - lVar155)
                                               ] * dVar187) * 0.5 + dVar188;
                    }
                    else {
                      lVar123 = lVar165 - lVar174;
                      dVar188 = pdVar37[lVar116 + lVar123 + lVar101 + lVar131];
                      dVar200 = dVar188 - pdVar37[lVar116 + lVar123 + lVar103 + lVar131];
                      dVar199 = pdVar37[lVar116 + lVar123 + lVar103 + lVar131] -
                                pdVar37[lVar116 + lVar123 + lVar105 + lVar131];
                      dVar191 = 0.0;
                      dVar192 = 0.0;
                      if (0.0 <= dVar200 * dVar199) {
                        dVar192 = ABS(dVar200);
                        if (ABS(dVar199) <= ABS(dVar200)) {
                          dVar192 = ABS(dVar199);
                        }
                        dVar192 = dVar192 + dVar192;
                      }
                      dVar203 = pdVar37[lVar116 + lVar123 + ((local_940 + 2) - lVar175) * lVar36 +
                                                            lVar131] -
                                pdVar37[lVar116 + lVar123 + lVar104 + lVar131];
                      dVar213 = pdVar37[lVar116 + lVar123 + lVar104 + lVar131] - dVar188;
                      dVar193 = (dVar213 + dVar203) * 0.5;
                      if (0.0 <= dVar213 * dVar203) {
                        dVar191 = ABS(dVar203);
                        if (ABS(dVar213) <= ABS(dVar203)) {
                          dVar191 = ABS(dVar213);
                        }
                        dVar191 = dVar191 + dVar191;
                      }
                      dVar206 = (dVar200 + dVar213) * 0.5;
                      dVar203 = 0.0;
                      if (0.0 <= dVar200 * dVar213) {
                        dVar203 = ABS(dVar213);
                        if (ABS(dVar200) <= ABS(dVar213)) {
                          dVar203 = ABS(dVar200);
                        }
                        dVar203 = dVar203 + dVar203;
                      }
                      dVar199 = (dVar200 + dVar199) * 0.5;
                      dVar200 = ABS(dVar199);
                      if (dVar192 <= dVar200) {
                        dVar200 = dVar192;
                      }
                      dVar192 = ABS(dVar193);
                      if (dVar191 <= dVar192) {
                        dVar192 = dVar191;
                      }
                      dVar192 = ABS(dVar206 * 1.3333333333333333 +
                                    (dVar192 * (double)((ulong)dVar193 & 0x8000000000000000 |
                                                       0x3ff0000000000000) +
                                    dVar200 * (double)((ulong)dVar199 & 0x8000000000000000 |
                                                      0x3ff0000000000000)) * -0.16666666666666666);
                      if (dVar203 <= dVar192) {
                        dVar192 = dVar203;
                      }
                      dVar188 = dVar192 * (double)((ulong)dVar206 & 0x8000000000000000 |
                                                  0x3ff0000000000000) *
                                (-1.0 - pdVar39[lVar117 + lVar102 + lVar42 * 2 + (lVar165 - lVar155)
                                               ] * dVar187) * 0.5 + dVar188;
                    }
                    dVar191 = pdVar54[lVar115 + lVar134 + lVar98];
                    if ((dVar191 != 1.0) || (NAN(dVar191))) {
LAB_00334a3c:
                      lVar123 = lVar165 - lVar184;
                      dVar200 = pdVar66[lVar118 + lVar123 + lVar106];
                      dVar199 = (pdVar66 + lVar118 + lVar123 + lVar106)[lVar69];
                      pdVar126 = pdVar57 + iVar89 * lVar33 +
                                           (iVar167 - iVar178) * lVar32 + (long)(iVar92 - iVar8);
                      dVar193 = pdVar126[lVar34 * 2];
                      dVar203 = *pdVar126;
                      dVar213 = pdVar126[lVar34];
                      lVar124 = (long)(iVar92 - iVar9);
                      dVar206 = pdVar37[lVar120 + lVar124 + lVar101 + lVar131];
                      dVar195 = pdVar37[lVar120 + lVar124 + lVar111 + lVar131];
                      uVar31 = pEVar51[lVar114 + lVar122 + (lVar2 - lVar168) * lVar53].flag;
                      lVar122 = -1;
                      cVar153 = '\x05';
                      lVar135 = 0;
                      do {
                        iVar138 = (int)lVar122;
                        lVar163 = -1;
                        cVar166 = cVar153;
                        do {
                          iVar93 = (int)lVar163;
                          iVar144 = (int)lVar135;
                          ppdVar125 = &local_2d8.q.p + (long)iVar144 * 3;
                          lVar135 = 0;
                          do {
                            iVar146 = (int)lVar135;
                            if ((iVar146 == 1 && (iVar93 == 0 && iVar138 == 0)) ||
                               ((1 << (cVar166 + (char)lVar135 & 0x1fU) & uVar31) == 0)) {
                              *ppdVar125 = (double *)0x0;
                              ppdVar125[1] = (double *)0x0;
                              ppdVar125[2] = (double *)0x0;
                            }
                            else {
                              pdVar126 = pdVar57 + (iVar89 + iVar138) * lVar33 +
                                                   ((iVar167 - iVar178) + iVar93) * lVar32 +
                                                   (long)(iVar83 + iVar146);
                              dVar192 = pdVar126[lVar34];
                              *ppdVar125 = (double *)
                                           ((*pdVar126 + (double)(iVar146 + -1)) - dVar203);
                              ppdVar125[1] = (double *)((dVar192 + (double)iVar93) - dVar213);
                              ppdVar125[2] = (double *)
                                             ((pdVar126[lVar34 * 2] + (double)iVar138) - dVar193);
                            }
                            lVar135 = lVar135 + 1;
                            ppdVar125 = ppdVar125 + 3;
                          } while (lVar135 != 3);
                          lVar163 = lVar163 + 1;
                          cVar166 = cVar166 + '\x03';
                          lVar135 = (long)iVar144 + 3;
                        } while (lVar163 != 2);
                        lVar122 = lVar122 + 1;
                        cVar153 = cVar153 + '\t';
                        lVar135 = (long)iVar144 + 3;
                      } while (lVar122 != 2);
                      lVar122 = -1;
                      cVar153 = '\x05';
                      lVar135 = 0;
                      do {
                        lVar163 = -1;
                        cVar166 = cVar153;
                        do {
                          iVar138 = (int)lVar135;
                          lVar135 = 0;
                          do {
                            dVar192 = 0.0;
                            if (((int)lVar135 != 1 || ((int)lVar163 != 0 || (int)lVar122 != 0)) &&
                               ((1 << (cVar166 + (char)lVar135 & 0x1fU) & uVar31) != 0)) {
                              dVar192 = pdVar37[lVar131 + (iVar90 + (int)lVar122) * lVar36 +
                                                          (iVar91 + (int)lVar163) * lVar35 +
                                                          (long)(int)(uVar5 + (int)lVar135)] -
                                        dVar195;
                            }
                            adStack_3b8[iVar138 + lVar135] = dVar192;
                            lVar135 = lVar135 + 1;
                          } while (lVar135 != 3);
                          lVar163 = lVar163 + 1;
                          cVar166 = cVar166 + '\x03';
                          lVar135 = (long)iVar138 + 3;
                        } while (lVar163 != 2);
                        lVar122 = lVar122 + 1;
                        cVar153 = cVar153 + '\t';
                        lVar135 = (long)iVar138 + 3;
                      } while (lVar122 != 2);
                      pdVar126 = &local_408;
                      lVar122 = 0;
                      do {
                        lVar135 = 0;
                        auVar196 = auVar215;
                        do {
                          auVar201 = auVar196 ^ auVar84;
                          if (auVar201._4_4_ == -0x80000000 && auVar201._0_4_ < -0x7ffffffd) {
                            *(undefined8 *)((long)pdVar126 + lVar135) = 0;
                            *(undefined8 *)((long)pdVar126 + lVar135 + 0x18) = 0;
                          }
                          lVar163 = auVar196._8_8_;
                          auVar196._0_8_ = auVar196._0_8_ + 2;
                          auVar196._8_8_ = lVar163 + 2;
                          lVar135 = lVar135 + 0x30;
                        } while (lVar135 != 0x60);
                        lVar122 = lVar122 + 1;
                        pdVar126 = pdVar126 + 1;
                      } while (lVar122 != 3);
                      dVar189 = 0.0;
                      dVar207 = 0.0;
                      dVar214 = 0.0;
                      pLVar136 = &local_2d8.q.kstride;
                      lVar122 = 0;
                      dVar211 = local_3c8;
                      dVar212 = local_408;
                      dVar197 = local_400;
                      dVar192 = local_3f8;
                      dVar216 = local_3e8;
                      dVar217 = dStack_3e0;
                      do {
                        dVar210 = (double)*pLVar136;
                        pdVar126 = ((Array4<const_double> *)(pLVar136 + -2))->p;
                        dVar190 = (double)pLVar136[-1];
                        dVar216 = dVar216 + dVar190 * (double)pLVar136[-1];
                        dVar217 = dVar217 + dVar190 * (double)*pLVar136;
                        dVar211 = dVar211 + dVar210 * dVar210;
                        dVar205 = adStack_3b8[lVar122];
                        dVar212 = dVar212 + (double)pdVar126 * (double)pdVar126;
                        dVar189 = dVar189 + dVar205 * (double)pdVar126;
                        dVar197 = dVar197 + dVar190 * (double)pdVar126;
                        dVar207 = dVar207 + dVar205 * dVar190;
                        dVar192 = dVar192 + dVar210 * (double)pdVar126;
                        dVar214 = dVar214 + dVar205 * dVar210;
                        lVar122 = lVar122 + 1;
                        pLVar136 = pLVar136 + 3;
                      } while (lVar122 != 0x1b);
                      dVar205 = dVar216 * dVar211 - dVar217 * dVar217;
                      dVar210 = dVar211 * dVar197 - dVar192 * dVar217;
                      dVar211 = dVar211 * dVar207 - dVar214 * dVar217;
                      dVar190 = dVar197 * dVar217 - dVar216 * dVar192;
                      local_ad8 = dVar192 * dVar190 + (dVar205 * dVar212 - dVar197 * dVar210);
                      local_a88 = (dVar192 * (dVar207 * dVar217 - dVar216 * dVar214) +
                                  (dVar205 * dVar189 - dVar197 * dVar211)) / local_ad8;
                      if ((dVar191 == 1.0) && (!NAN(dVar191))) {
                        if ((pdVar54[lVar115 + lVar98 + ((lVar165 + -1) - lVar169)] == 1.0) &&
                           (!NAN(pdVar54[lVar115 + lVar98 + ((lVar165 + -1) - lVar169)]))) {
                          if ((pdVar54[lVar115 + lVar98 + ((lVar165 + 1) - lVar169)] == 1.0) &&
                             (!NAN(pdVar54[lVar115 + lVar98 + ((lVar165 + 1) - lVar169)]))) {
                            dVar204 = dVar195 - pdVar37[lVar120 + lVar111 + lVar131 + ((lVar165 + -1
                                                                                       ) - lVar174)]
                            ;
                            dVar202 = pdVar37[lVar120 + lVar111 + lVar131 + ((lVar165 + 1) - lVar174
                                                                            )] - dVar195;
                            dVar204 = dVar204 + dVar204;
                            dVar202 = dVar202 + dVar202;
                            dVar205 = (pdVar37[lVar120 + lVar111 + lVar131 + ((lVar165 + 1) -
                                                                             lVar174)] -
                                      pdVar37[lVar120 + lVar111 + lVar131 + ((lVar165 + -1) -
                                                                            lVar174)]) * 0.5;
                            dVar209 = ABS(dVar204);
                            uVar186 = -(ulong)(0.0 < dVar205);
                            dVar205 = ABS(dVar205);
                            dVar194 = ABS(dVar202);
                            if (dVar209 <= dVar205) {
                              dVar205 = dVar209;
                            }
                            if (dVar205 <= dVar194) {
                              dVar194 = dVar205;
                            }
                            uVar198 = -(ulong)(0.0 < dVar204 * dVar202) & (ulong)dVar194;
                            local_a88 = (double)(~uVar186 & (uVar198 ^ 0x8000000000000000) |
                                                uVar186 & uVar198);
                          }
                        }
                      }
                      dVar205 = dVar197 * dVar214 - dVar192 * dVar207;
                      local_af8 = (dVar192 * dVar205 + (dVar211 * dVar212 - dVar210 * dVar189)) /
                                  local_ad8;
                      if (((((dVar191 == 1.0) && (!NAN(dVar191))) &&
                           (pdVar54[lVar121 + lVar98 + lVar134] == 1.0)) &&
                          ((!NAN(pdVar54[lVar121 + lVar98 + lVar134]) &&
                           (pdVar54[lVar150 + lVar98 + lVar134] == 1.0)))) &&
                         (!NAN(pdVar54[lVar150 + lVar98 + lVar134]))) {
                        dVar194 = dVar195 - pdVar37[lVar139 + lVar111 + lVar131 + lVar124];
                        dVar204 = pdVar37[lVar147 + lVar111 + lVar131 + lVar124] - dVar195;
                        dVar194 = dVar194 + dVar194;
                        dVar204 = dVar204 + dVar204;
                        dVar192 = (pdVar37[lVar147 + lVar111 + lVar131 + lVar124] -
                                  pdVar37[lVar139 + lVar111 + lVar131 + lVar124]) * 0.5;
                        dVar210 = ABS(dVar194);
                        uVar186 = -(ulong)(0.0 < dVar192);
                        dVar192 = ABS(dVar192);
                        dVar211 = ABS(dVar204);
                        if (dVar210 <= dVar192) {
                          dVar192 = dVar210;
                        }
                        if (dVar192 <= dVar211) {
                          dVar211 = dVar192;
                        }
                        uVar198 = -(ulong)(0.0 < dVar194 * dVar204) & (ulong)dVar211;
                        local_af8 = (double)(~uVar186 & (uVar198 ^ 0x8000000000000000) |
                                            uVar186 & uVar198);
                      }
                      local_ad8 = (dVar189 * dVar190 +
                                  (dVar212 * (dVar216 * dVar214 - dVar217 * dVar207) -
                                  dVar205 * dVar197)) / local_ad8;
                      if (((dVar191 == 1.0) && (!NAN(dVar191))) &&
                         ((dVar208 == 1.0 &&
                          (((!NAN(dVar208) && (pdVar54[lVar115 + lVar134 + lVar99] == 1.0)) &&
                           (!NAN(pdVar54[lVar115 + lVar134 + lVar99]))))))) {
                        dVar212 = dVar195 - pdVar37[lVar120 + lVar124 + lVar105 + lVar131];
                        dVar211 = (dVar206 - dVar195) + (dVar206 - dVar195);
                        dVar212 = dVar212 + dVar212;
                        dVar192 = (dVar206 - pdVar37[lVar120 + lVar124 + lVar105 + lVar131]) * 0.5;
                        dVar197 = ABS(dVar212);
                        uVar186 = -(ulong)(0.0 < dVar192);
                        dVar192 = ABS(dVar192);
                        dVar214 = ABS(dVar211);
                        if (dVar197 <= dVar192) {
                          dVar192 = dVar197;
                        }
                        if (dVar192 <= dVar214) {
                          dVar214 = dVar192;
                        }
                        uVar198 = -(ulong)(0.0 < dVar212 * dVar211) & (ulong)dVar214;
                        local_ad8 = (double)(~uVar186 & (uVar198 ^ 0x8000000000000000) |
                                            uVar186 & uVar198);
                      }
                      dVar192 = dVar195;
                      if (dVar206 <= dVar195) {
                        dVar192 = dVar206;
                      }
                      dVar199 = dVar199 - dVar213;
                      dVar214 = dVar195;
                      if (dVar195 <= dVar206) {
                        dVar214 = dVar206;
                      }
                      dVar200 = dVar200 - dVar203;
                      iVar93 = 0;
                      iVar138 = 0;
                      iVar144 = 0;
                      iVar146 = 0;
                      uVar137 = 0xffffffff;
                      do {
                        uVar128 = uVar137 + 1;
                        uVar148 = 0xffffffff;
                        iVar179 = iVar93;
                        do {
                          uVar1 = uVar148 + 1;
                          iVar129 = 5;
                          do {
                            if (((uVar31 >> (iVar179 + iVar129 & 0x1fU) & 1) != 0) &&
                               ((iVar129 != 6 || uVar148 != 0) || uVar137 != 0)) {
                              iVar138 = iVar138 + (uint)((iVar129 - 5U & 0xfffffffd) == 0 &&
                                                        (uVar148 == 0 && uVar137 == 0));
                              iVar144 = iVar144 + (uint)((iVar129 == 6 && uVar137 == 0) &&
                                                        (uVar1 & 0xfffffffd) == 0);
                              iVar146 = iVar146 + (uint)((iVar129 == 6 && uVar148 == 0) &&
                                                        (uVar128 & 0xfffffffd) == 0);
                            }
                            iVar129 = iVar129 + 1;
                          } while (iVar129 != 8);
                          iVar179 = iVar179 + 3;
                          uVar148 = uVar1;
                        } while (uVar1 != 2);
                        iVar93 = iVar93 + 9;
                        uVar137 = uVar128;
                      } while (uVar128 != 2);
                      dVar206 = 2.0;
                      if ((uVar31 >> 0x15 & 1) != 0) {
                        lVar122 = -1;
                        cVar153 = '\b';
                        dVar206 = dVar195;
                        dVar211 = dVar195;
                        do {
                          lVar124 = 0;
                          cVar166 = cVar153;
                          do {
                            lVar135 = 0;
                            dVar212 = dVar206;
                            do {
                              dVar206 = dVar212;
                              if (((int)lVar135 != 1 || ((int)lVar124 != 0 || (int)lVar122 != 0)) &&
                                 ((1 << (cVar166 + (char)lVar135 & 0x1fU) & uVar31) != 0)) {
                                dVar197 = pdVar37[lVar131 + (iVar90 + (int)lVar122) * lVar36 +
                                                            (iVar91 + (int)lVar124) * lVar35 +
                                                            (long)(int)(uVar5 + (int)lVar135)];
                                dVar206 = dVar197;
                                if (dVar197 <= dVar212) {
                                  dVar206 = dVar212;
                                }
                                if (dVar197 < dVar211) {
                                  dVar211 = dVar197;
                                }
                              }
                              lVar135 = lVar135 + 1;
                              dVar212 = dVar206;
                            } while (lVar135 != 3);
                            cVar166 = cVar166 + '\x03';
                            bVar185 = lVar124 == 0;
                            lVar124 = lVar124 + 1;
                          } while (bVar185);
                          lVar122 = lVar122 + 1;
                          cVar153 = cVar153 + '\t';
                        } while (lVar122 != 2);
                        dVar212 = (((pdVar62 + lVar151 + lVar112 + (lVar165 - lVar182))[lVar65] -
                                   dVar193) * local_ad8 +
                                  (0.5 - dVar213) * local_af8 +
                                  (pdVar62[lVar151 + lVar112 + (lVar165 - lVar182)] - dVar203) *
                                  local_a88 + dVar195) - dVar195;
                        if (dVar212 <= 1e-13) {
                          dVar206 = 1.0;
                          if ((dVar212 < -1e-13) &&
                             (dVar206 = (dVar211 - dVar195) / dVar212, 1.0 <= dVar206)) {
                            dVar206 = 1.0;
                          }
                        }
                        else {
                          dVar206 = (dVar206 - dVar195) / dVar212;
                          if (1.0 <= dVar206) {
                            dVar206 = 1.0;
                          }
                        }
                        if (2.0 <= dVar206) {
                          dVar206 = 2.0;
                        }
                      }
                      dVar211 = dVar206;
                      if ((short)uVar31 < 0) {
                        lVar122 = -1;
                        cVar153 = '\x05';
                        pdVar126 = pdVar152;
                        dVar211 = dVar195;
                        dVar212 = dVar195;
                        do {
                          lVar124 = -1;
                          pdVar159 = pdVar126;
                          cVar166 = cVar153;
                          do {
                            lVar135 = -1;
                            dVar197 = dVar211;
                            do {
                              dVar211 = dVar197;
                              if ((((int)lVar124 != 0 || (int)lVar122 != 0) || (int)lVar135 != 0) &&
                                 ((1 << (cVar166 + (char)lVar135 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar216 = pdVar159[lVar135];
                                dVar211 = dVar216;
                                if (dVar216 <= dVar197) {
                                  dVar211 = dVar197;
                                }
                                if (dVar216 < dVar212) {
                                  dVar212 = dVar216;
                                }
                              }
                              lVar135 = lVar135 + 1;
                              dVar197 = dVar211;
                            } while (lVar135 != 2);
                            pdVar159 = pdVar159 + lVar35;
                            cVar166 = cVar166 + '\x03';
                            bVar185 = lVar124 != 0;
                            lVar124 = lVar124 + 1;
                          } while (bVar185);
                          lVar122 = lVar122 + 1;
                          pdVar126 = pdVar126 + lVar36;
                          cVar153 = cVar153 + '\t';
                        } while (lVar122 != 2);
                        dVar197 = (((pdVar62 + lVar157 + lVar112 + (lVar165 - lVar182))[lVar65] -
                                   dVar193) * local_ad8 +
                                  (((pdVar62[lVar157 + lVar112 + (lVar165 - lVar182)] - dVar203) *
                                    local_a88 + dVar195) - (dVar213 + 0.5) * local_af8)) - dVar195;
                        if (dVar197 <= 1e-13) {
                          dVar211 = 1.0;
                          if ((dVar197 < -1e-13) &&
                             (dVar211 = (dVar212 - dVar195) / dVar197, 1.0 <= dVar211)) {
                            dVar211 = 1.0;
                          }
                        }
                        else {
                          dVar211 = (dVar211 - dVar195) / dVar197;
                          if (1.0 <= dVar211) {
                            dVar211 = 1.0;
                          }
                        }
                        if (dVar206 <= dVar211) {
                          dVar211 = dVar206;
                        }
                      }
                      dVar206 = dVar211;
                      if ((uVar31 >> 0x13 & 1) != 0) {
                        lVar122 = -1;
                        cVar153 = '\x06';
                        dVar206 = dVar195;
                        dVar212 = dVar195;
                        do {
                          lVar124 = -1;
                          cVar166 = cVar153;
                          do {
                            lVar135 = 0;
                            do {
                              if ((((int)lVar124 != 0 || (int)lVar122 != 0) || (int)lVar135 != 0) &&
                                 ((1 << (cVar166 + (char)lVar135 & 0x1fU) & uVar31) != 0)) {
                                dVar197 = pdVar37[lVar131 + (iVar90 + (int)lVar122) * lVar36 +
                                                            (iVar91 + (int)lVar124) * lVar35 +
                                                            (long)(iVar145 + (int)lVar135)];
                                dVar216 = dVar197;
                                if (dVar197 <= dVar206) {
                                  dVar216 = dVar206;
                                }
                                dVar206 = dVar216;
                                if (dVar197 < dVar212) {
                                  dVar212 = dVar197;
                                }
                              }
                              lVar135 = lVar135 + 1;
                            } while (lVar135 == 1);
                            lVar124 = lVar124 + 1;
                            cVar166 = cVar166 + '\x03';
                          } while (lVar124 != 2);
                          lVar122 = lVar122 + 1;
                          cVar153 = cVar153 + '\t';
                        } while (lVar122 != 2);
                        dVar197 = (((pdVar58 + lVar162 + lVar113 + ((iVar92 - iVar23) + 1))[lVar61]
                                   - dVar193) * local_ad8 +
                                  (pdVar58[lVar162 + lVar113 + ((iVar92 - iVar23) + 1)] - dVar213) *
                                  local_af8 + (0.5 - dVar203) * local_a88 + dVar195) - dVar195;
                        if (dVar197 <= 1e-13) {
                          dVar206 = 1.0;
                          if ((dVar197 < -1e-13) &&
                             (dVar206 = (dVar212 - dVar195) / dVar197, 1.0 <= dVar206)) {
                            dVar206 = 1.0;
                          }
                        }
                        else {
                          dVar206 = (dVar206 - dVar195) / dVar197;
                          if (1.0 <= dVar206) {
                            dVar206 = 1.0;
                          }
                        }
                        if (dVar211 <= dVar206) {
                          dVar206 = dVar211;
                        }
                      }
                      dVar211 = dVar206;
                      if ((uVar31 >> 0x11 & 1) != 0) {
                        lVar122 = -1;
                        cVar153 = '\x05';
                        dVar211 = dVar195;
                        dVar212 = dVar195;
                        do {
                          lVar124 = -1;
                          cVar166 = cVar153;
                          do {
                            lVar135 = -1;
                            do {
                              if ((((int)lVar124 != 0 || (int)lVar122 != 0) || (int)lVar135 != 0) &&
                                 ((1 << (cVar166 + (char)lVar135 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar197 = pdVar37[lVar131 + (iVar90 + (int)lVar122) * lVar36 +
                                                            (iVar91 + (int)lVar124) * lVar35 +
                                                            (long)(iVar145 + (int)lVar135)];
                                dVar216 = dVar197;
                                if (dVar197 <= dVar211) {
                                  dVar216 = dVar211;
                                }
                                dVar211 = dVar216;
                                if (dVar197 < dVar212) {
                                  dVar212 = dVar197;
                                }
                              }
                              lVar135 = lVar135 + 1;
                            } while (lVar135 != 1);
                            lVar124 = lVar124 + 1;
                            cVar166 = cVar166 + '\x03';
                          } while (lVar124 != 2);
                          lVar122 = lVar122 + 1;
                          cVar153 = cVar153 + '\t';
                        } while (lVar122 != 2);
                        dVar197 = (((pdVar58 + lVar162 + lVar113 + (lVar165 - iVar23))[lVar61] -
                                   dVar193) * local_ad8 +
                                  (pdVar58[lVar162 + lVar113 + (lVar165 - iVar23)] - dVar213) *
                                  local_af8 + (dVar195 - (dVar203 + 0.5) * local_a88)) - dVar195;
                        if (dVar197 <= 1e-13) {
                          dVar211 = 1.0;
                          if ((dVar197 < -1e-13) &&
                             (dVar211 = (dVar212 - dVar195) / dVar197, 1.0 <= dVar211)) {
                            dVar211 = 1.0;
                          }
                        }
                        else {
                          dVar211 = (dVar211 - dVar195) / dVar197;
                          if (1.0 <= dVar211) {
                            dVar211 = 1.0;
                          }
                        }
                        if (dVar206 <= dVar211) {
                          dVar211 = dVar206;
                        }
                      }
                      dVar206 = dVar211;
                      if ((uVar31 >> 0x1b & 1) != 0) {
                        cVar153 = '\x0e';
                        lVar122 = 0;
                        dVar212 = dVar195;
                        dVar206 = dVar195;
                        do {
                          lVar124 = -1;
                          cVar166 = cVar153;
                          do {
                            lVar135 = -1;
                            do {
                              if ((((int)lVar124 != 0 || (int)lVar122 != 0) || (int)lVar135 != 0) &&
                                 ((1 << (cVar166 + (char)lVar135 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar197 = pdVar37[lVar131 + (iVar90 + (int)lVar122) * lVar36 +
                                                            (iVar91 + (int)lVar124) * lVar35 +
                                                            (long)(iVar145 + (int)lVar135)];
                                dVar216 = dVar197;
                                if (dVar197 <= dVar206) {
                                  dVar216 = dVar206;
                                }
                                dVar206 = dVar216;
                                if (dVar197 < dVar212) {
                                  dVar212 = dVar197;
                                }
                              }
                              lVar135 = lVar135 + 1;
                            } while (lVar135 != 2);
                            lVar124 = lVar124 + 1;
                            cVar166 = cVar166 + '\x03';
                          } while (lVar124 != 2);
                          cVar153 = cVar153 + '\t';
                          bVar185 = lVar122 == 0;
                          lVar122 = lVar122 + 1;
                        } while (bVar185);
                        dVar197 = ((0.5 - dVar193) * local_ad8 +
                                  dVar199 * local_af8 + dVar200 * local_a88 + dVar195) - dVar195;
                        if (dVar197 <= 1e-13) {
                          dVar206 = 1.0;
                          if ((dVar197 < -1e-13) &&
                             (dVar206 = (dVar212 - dVar195) / dVar197, 1.0 <= dVar206)) {
                            dVar206 = 1.0;
                          }
                        }
                        else {
                          dVar206 = (dVar206 - dVar195) / dVar197;
                          if (1.0 <= dVar206) {
                            dVar206 = 1.0;
                          }
                        }
                        if (dVar211 <= dVar206) {
                          dVar206 = dVar211;
                        }
                      }
                      dVar211 = dVar206;
                      if ((uVar31 >> 9 & 1) != 0) {
                        cVar153 = '\x05';
                        lVar122 = -1;
                        dVar211 = dVar195;
                        dVar212 = dVar195;
                        do {
                          lVar124 = -1;
                          cVar166 = cVar153;
                          do {
                            lVar135 = -1;
                            do {
                              if ((((int)lVar124 != 0 || (int)lVar122 != 0) || (int)lVar135 != 0) &&
                                 ((1 << (cVar166 + (char)lVar135 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar197 = pdVar37[lVar131 + (iVar90 + (int)lVar122) * lVar36 +
                                                            (iVar91 + (int)lVar124) * lVar35 +
                                                            (long)(iVar145 + (int)lVar135)];
                                dVar216 = dVar197;
                                if (dVar197 <= dVar211) {
                                  dVar216 = dVar211;
                                }
                                dVar211 = dVar216;
                                if (dVar197 < dVar212) {
                                  dVar212 = dVar197;
                                }
                              }
                              lVar135 = lVar135 + 1;
                            } while (lVar135 != 2);
                            lVar124 = lVar124 + 1;
                            cVar166 = cVar166 + '\x03';
                          } while (lVar124 != 2);
                          cVar153 = cVar153 + '\t';
                          bVar185 = lVar122 != 0;
                          lVar122 = lVar122 + 1;
                        } while (bVar185);
                        dVar203 = ((((pdVar66 + lVar118 + lVar123 + (lVar2 - iVar27) * lVar68)
                                     [lVar69] - dVar213) * local_af8 +
                                   (pdVar66[lVar118 + lVar123 + (lVar2 - iVar27) * lVar68] - dVar203
                                   ) * local_a88 + dVar195) - (dVar193 + 0.5) * local_ad8) - dVar195
                        ;
                        if (dVar203 <= 1e-13) {
                          dVar211 = 1.0;
                          if ((dVar203 < -1e-13) &&
                             (dVar211 = (dVar212 - dVar195) / dVar203, 1.0 <= dVar211)) {
                            dVar211 = 1.0;
                          }
                        }
                        else {
                          dVar211 = (dVar211 - dVar195) / dVar203;
                          if (1.0 <= dVar211) {
                            dVar211 = 1.0;
                          }
                        }
                        if (dVar206 <= dVar211) {
                          dVar211 = dVar206;
                        }
                      }
                      dVar203 = 0.0;
                      if (1 < iVar138) {
                        dVar203 = dVar211;
                      }
                      dVar213 = 0.0;
                      if (1 < iVar144) {
                        dVar213 = dVar211;
                      }
                      dVar206 = 0.0;
                      if (1 < iVar146) {
                        dVar206 = dVar211;
                      }
                      if ((((dVar191 == 1.0) && (!NAN(dVar191))) &&
                          (pdVar54[lVar115 + lVar98 + (int)(~uVar20 + iVar92)] == 1.0)) &&
                         (((!NAN(pdVar54[lVar115 + lVar98 + (int)(~uVar20 + iVar92)]) &&
                           (pdVar54[lVar115 + lVar98 + (int)((iVar92 - uVar20) + 1)] == 1.0)) &&
                          (!NAN(pdVar54[lVar115 + lVar98 + (int)((iVar92 - uVar20) + 1)]))))) {
                        dVar203 = 1.0;
                      }
                      if (((dVar191 == 1.0) && (!NAN(dVar191))) &&
                         ((pdVar54[lVar142 + lVar98 + lVar134] == 1.0 &&
                          (((!NAN(pdVar54[lVar142 + lVar98 + lVar134]) &&
                            (pdVar54[lVar172 + lVar98 + lVar134] == 1.0)) &&
                           (!NAN(pdVar54[lVar172 + lVar98 + lVar134]))))))) {
                        dVar213 = 1.0;
                      }
                      if (((dVar191 == 1.0) && (!NAN(dVar191))) &&
                         (((dVar208 == 1.0 &&
                           ((!NAN(dVar208) &&
                            (pdVar54[lVar115 + lVar134 + ((iVar127 - iVar22) + -2) * lVar56] == 1.0)
                            ))) && (!NAN(pdVar54[lVar115 + lVar134 + ((iVar127 - iVar22) + -2) *
                                                                     lVar56]))))) {
                        dVar206 = 1.0;
                      }
                      dVar208 = (0.5 - dVar193) * local_ad8 * dVar206 +
                                dVar199 * local_af8 * dVar213 +
                                dVar200 * local_a88 * dVar203 + dVar195;
                      if (dVar208 <= dVar214) {
                        dVar214 = dVar208;
                      }
                      if (dVar192 <= dVar214) {
                        dVar192 = dVar214;
                      }
                      dVar192 = pdVar39[lVar117 + lVar132 + lVar42 * 2 + (lVar165 - lVar155)] *
                                dVar187 * -0.5 * local_ad8 * dVar206 + dVar192;
                      auVar215 = _DAT_006979b0;
                    }
                    else {
                      dVar192 = pdVar54[lVar115 + lVar134 + ((int)lVar3 - iVar22) * lVar56];
                      if (((dVar192 != 1.0) ||
                          (((NAN(dVar192) || (dVar208 != 1.0)) || (NAN(dVar208))))) ||
                         ((((pdVar54[lVar115 + lVar134 + ((iVar127 + -3) - iVar22) * lVar56] != 1.0
                            || (NAN(pdVar54[lVar115 + lVar134 + ((iVar127 + -3) - iVar22) * lVar56])
                               )) || (pdVar54[lVar115 + lVar134 + ((int)lVar4 - iVar22) * lVar56] !=
                                      1.0)) ||
                          (NAN(pdVar54[lVar115 + lVar134 + ((int)lVar4 - iVar22) * lVar56]))))) {
                        if (((dVar208 != 1.0) || (NAN(dVar208))) ||
                           ((dVar192 != 1.0 || (NAN(dVar192))))) goto LAB_00334a3c;
                        lVar122 = lVar165 - lVar174;
                        dVar192 = pdVar37[lVar116 + lVar122 + lVar103 + lVar131];
                        dVar200 = dVar192 - pdVar37[lVar116 + lVar122 + lVar133 + lVar131];
                        dVar199 = pdVar37[lVar116 + lVar122 + lVar101 + lVar131] - dVar192;
                        dVar200 = dVar200 + dVar200;
                        dVar199 = dVar199 + dVar199;
                        dVar208 = (pdVar37[lVar116 + lVar122 + lVar101 + lVar131] -
                                  pdVar37[lVar116 + lVar122 + lVar133 + lVar131]) * 0.5;
                        dVar193 = ABS(dVar200);
                        uVar186 = -(ulong)(0.0 < dVar208);
                        dVar208 = ABS(dVar208);
                        dVar191 = ABS(dVar199);
                        if (dVar193 <= dVar208) {
                          dVar208 = dVar193;
                        }
                        if (dVar208 <= dVar191) {
                          dVar191 = dVar208;
                        }
                        uVar198 = -(ulong)(0.0 < dVar200 * dVar199) & (ulong)dVar191;
                        dVar192 = (double)(~uVar186 & (uVar198 ^ 0x8000000000000000) |
                                          uVar186 & uVar198) *
                                  (1.0 - pdVar39[lVar117 + lVar132 + lVar42 * 2 +
                                                                     (lVar165 - lVar155)] * dVar187)
                                  * 0.5 + dVar192;
                      }
                      else {
                        lVar122 = lVar165 - lVar174;
                        dVar192 = pdVar37[lVar116 + lVar122 + lVar103 + lVar131];
                        dVar200 = dVar192 - pdVar37[lVar116 + lVar122 + lVar133 + lVar131];
                        dVar199 = pdVar37[lVar116 + lVar122 + lVar133 + lVar131] -
                                  pdVar37[lVar116 + lVar122 + ((iVar127 + -3) - iVar11) * lVar36 +
                                                              lVar131];
                        dVar191 = 0.0;
                        dVar208 = 0.0;
                        if (0.0 <= dVar200 * dVar199) {
                          dVar208 = ABS(dVar200);
                          if (ABS(dVar199) <= ABS(dVar200)) {
                            dVar208 = ABS(dVar199);
                          }
                          dVar208 = dVar208 + dVar208;
                        }
                        dVar193 = pdVar37[lVar116 + lVar122 + ((int)lVar4 - iVar11) * lVar36 +
                                                              lVar131] -
                                  pdVar37[lVar116 + lVar122 + lVar101 + lVar131];
                        dVar213 = pdVar37[lVar116 + lVar122 + lVar101 + lVar131] - dVar192;
                        dVar203 = (dVar213 + dVar193) * 0.5;
                        if (0.0 <= dVar213 * dVar193) {
                          dVar191 = ABS(dVar193);
                          if (ABS(dVar213) <= ABS(dVar193)) {
                            dVar191 = ABS(dVar213);
                          }
                          dVar191 = dVar191 + dVar191;
                        }
                        dVar206 = (dVar200 + dVar213) * 0.5;
                        dVar193 = 0.0;
                        if (0.0 <= dVar200 * dVar213) {
                          dVar193 = ABS(dVar213);
                          if (ABS(dVar200) <= ABS(dVar213)) {
                            dVar193 = ABS(dVar200);
                          }
                          dVar193 = dVar193 + dVar193;
                        }
                        dVar199 = (dVar200 + dVar199) * 0.5;
                        dVar200 = ABS(dVar199);
                        if (dVar208 <= dVar200) {
                          dVar200 = dVar208;
                        }
                        dVar208 = ABS(dVar203);
                        if (dVar191 <= dVar208) {
                          dVar208 = dVar191;
                        }
                        dVar208 = ABS(dVar206 * 1.3333333333333333 +
                                      (dVar208 * (double)((ulong)dVar203 & 0x8000000000000000 |
                                                         0x3ff0000000000000) +
                                      dVar200 * (double)((ulong)dVar199 & 0x8000000000000000 |
                                                        0x3ff0000000000000)) * -0.16666666666666666)
                        ;
                        if (dVar193 <= dVar208) {
                          dVar208 = dVar193;
                        }
                        dVar192 = dVar208 * (double)((ulong)dVar206 & 0x8000000000000000 |
                                                    0x3ff0000000000000) *
                                  (1.0 - pdVar39[lVar117 + lVar132 + lVar42 * 2 +
                                                                     (lVar165 - lVar155)] * dVar187)
                                  * 0.5 + dVar192;
                        auVar215 = _DAT_006979b0;
                      }
                    }
                  }
                  pdVar47[local_948 * lVar50 +
                          (int)(~uVar17 + iVar127) * lVar49 +
                          (local_930 - iVar16) * lVar48 + (lVar165 - iVar15)] = dVar192;
                  pdVar43[local_948 * lVar46 +
                          (local_940 - iVar140) * lVar45 +
                          (local_930 - iVar14) * lVar44 + (lVar165 - iVar13)] = dVar188;
                  lVar165 = lVar165 + 1;
                  local_7a0 = local_7a0 + 1;
                  local_798 = local_798 + 1;
                  pdVar158 = pdVar158 + 1;
                  local_ac0 = local_ac0 + 0x100000000;
                  local_778 = local_778 + 0x100000000;
                  iVar83 = iVar83 + 1;
                  uVar5 = uVar5 + 1;
                  pdVar152 = pdVar152 + 1;
                  iVar145 = iVar145 + 1;
                } while (iVar28 + 1 != (int)lVar165);
              }
              local_930 = local_930 + 1;
              local_830 = local_830 + lVar32;
              local_828 = local_828 + lVar32;
              local_820 = local_820 + lVar32;
              local_928 = local_928 + lVar35;
            } while (iVar29 + 1 != (int)local_930);
          }
          local_940 = local_940 + 1;
          local_868 = local_868 + lVar33;
          local_860 = local_860 + lVar33;
          local_858 = local_858 + lVar33;
          local_938 = local_938 + lVar36;
        } while (iVar30 + 1 != (int)local_940);
      }
      local_948 = local_948 + 1;
      local_8a0 = local_8a0 + lVar38;
    } while (local_948 != 3);
  }
  else {
    local_2d8.q.p = q->p;
    local_2d8.q.jstride = q->jstride;
    local_2d8.q.kstride = q->kstride;
    local_2d8.q.nstride = q->nstride;
    local_2d8.q.begin.x = (q->begin).x;
    local_2d8.q.begin.y = (q->begin).y;
    uVar70 = *(undefined8 *)&(q->begin).z;
    uVar71 = (q->end).y;
    local_2d8.q._52_8_ = *(undefined8 *)&(q->end).z;
    local_2d8.q.begin.z = (int)uVar70;
    local_2d8.q.end.x = (int)((ulong)uVar70 >> 0x20);
    local_2d8.ccvel.p = ccvel->p;
    local_2d8.ccvel.jstride = ccvel->jstride;
    local_2d8.ccvel.kstride = ccvel->kstride;
    local_2d8.ccvel.nstride = ccvel->nstride;
    local_2d8.ccvel.begin.x = (ccvel->begin).x;
    local_2d8.ccvel.begin.y = (ccvel->begin).y;
    uVar72 = (ccvel->end).x;
    uVar73 = (ccvel->end).y;
    local_2d8.ccvel._52_8_ = *(undefined8 *)&(ccvel->end).z;
    local_2d8.ccvel.begin.z = (int)*(undefined8 *)&(ccvel->begin).z;
    local_2d8.Imz.p = Imz->p;
    local_2d8.Imz.jstride = Imz->jstride;
    local_2d8.Imz.kstride = Imz->kstride;
    local_2d8.Imz.nstride = Imz->nstride;
    local_2d8.Imz.begin.x = (Imz->begin).x;
    local_2d8.Imz.begin.y = (Imz->begin).y;
    uVar70 = *(undefined8 *)&(Imz->begin).z;
    uVar74 = (Imz->end).y;
    local_2d8.Imz._52_8_ = *(undefined8 *)&(Imz->end).z;
    local_2d8.Imz.begin.z = (int)uVar70;
    local_2d8.Imz.end.x = (int)((ulong)uVar70 >> 0x20);
    local_2d8.Ipz.p = Ipz->p;
    local_2d8.Ipz.jstride = Ipz->jstride;
    local_2d8.Ipz.kstride = Ipz->kstride;
    local_2d8.Ipz.nstride = Ipz->nstride;
    local_2d8.Ipz.begin.x = (Ipz->begin).x;
    local_2d8.Ipz.begin.y = (Ipz->begin).y;
    uVar75 = (Ipz->end).x;
    uVar76 = (Ipz->end).y;
    local_2d8.Ipz._52_8_ = *(undefined8 *)&(Ipz->end).z;
    local_2d8.Ipz.begin.z = (int)*(undefined8 *)&(Ipz->begin).z;
    local_2d8.pbc = pbc;
    local_2d8.flag.p = flag->p;
    local_2d8.flag.jstride = flag->jstride;
    local_2d8.flag.kstride = flag->kstride;
    local_2d8.flag.nstride = flag->nstride;
    local_2d8.flag.begin.x = (flag->begin).x;
    local_2d8.flag.begin.y = (flag->begin).y;
    uVar70 = *(undefined8 *)&(flag->begin).z;
    uVar77 = (flag->end).y;
    local_2d8.flag._52_8_ = *(undefined8 *)&(flag->end).z;
    local_2d8.flag.begin.z = (int)uVar70;
    local_2d8.flag.end.x = (int)((ulong)uVar70 >> 0x20);
    local_2d8.vfrac.p = vfrac->p;
    local_2d8.vfrac.jstride = vfrac->jstride;
    local_2d8.vfrac.kstride = vfrac->kstride;
    local_2d8.vfrac.nstride = vfrac->nstride;
    local_2d8.vfrac.begin.x = (vfrac->begin).x;
    local_2d8.vfrac.begin.y = (vfrac->begin).y;
    uVar70 = *(undefined8 *)&(vfrac->begin).z;
    uVar78 = (vfrac->end).y;
    local_2d8.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
    local_2d8.vfrac.begin.z = (int)uVar70;
    local_2d8.vfrac.end.x = (int)((ulong)uVar70 >> 0x20);
    local_2d8.ccc.p = ccc->p;
    local_2d8.ccc.jstride = ccc->jstride;
    local_2d8.ccc.kstride = ccc->kstride;
    local_2d8.ccc.nstride = ccc->nstride;
    local_2d8.ccc.begin.x = (ccc->begin).x;
    local_2d8.ccc.begin.y = (ccc->begin).y;
    uVar70 = *(undefined8 *)&(ccc->begin).z;
    uVar79 = (ccc->end).y;
    local_2d8.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
    local_2d8.ccc.begin.z = (int)uVar70;
    local_2d8.ccc.end.x = (int)((ulong)uVar70 >> 0x20);
    local_2d8.fcx.p = fcx->p;
    local_2d8.fcx.jstride = fcx->jstride;
    local_2d8.fcx.kstride = fcx->kstride;
    local_2d8.fcx.nstride = fcx->nstride;
    local_2d8.fcx.begin.x = (fcx->begin).x;
    local_2d8.fcx.begin.y = (fcx->begin).y;
    uVar70 = *(undefined8 *)&(fcx->begin).z;
    uVar80 = (fcx->end).y;
    local_2d8.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
    local_2d8.fcx.begin.z = (int)uVar70;
    local_2d8.fcx.end.x = (int)((ulong)uVar70 >> 0x20);
    local_2d8.fcy.p = fcy->p;
    local_2d8.fcy.jstride = fcy->jstride;
    local_2d8.fcy.kstride = fcy->kstride;
    local_2d8.fcy.nstride = fcy->nstride;
    local_2d8.fcy.begin.x = (fcy->begin).x;
    local_2d8.fcy.begin.y = (fcy->begin).y;
    uVar70 = *(undefined8 *)&(fcy->begin).z;
    uVar81 = (fcy->end).y;
    local_2d8.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
    local_2d8.fcy.begin.z = (int)uVar70;
    local_2d8.fcy.end.x = (int)((ulong)uVar70 >> 0x20);
    local_2d8.fcz.p = fcz->p;
    local_2d8.fcz.jstride = fcz->jstride;
    local_2d8.fcz.kstride = fcz->kstride;
    local_2d8.fcz.nstride = fcz->nstride;
    local_2d8.fcz.begin.x = (fcz->begin).x;
    local_2d8.fcz.begin.y = (fcz->begin).y;
    uVar70 = *(undefined8 *)&(fcz->begin).z;
    uVar82 = (fcz->end).y;
    local_2d8.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
    local_2d8.fcz.begin.z = (int)uVar70;
    local_2d8.fcz.end.x = (int)((ulong)uVar70 >> 0x20);
    iVar9 = (zebox->smallend).vect[0];
    iVar10 = (zebox->smallend).vect[1];
    iVar11 = (zebox->smallend).vect[2];
    iVar12 = (zebox->bigend).vect[0];
    iVar13 = (zebox->bigend).vect[1];
    iVar14 = (zebox->bigend).vect[2];
    iVar140 = 0;
    local_2d8.q.end.y = uVar71;
    local_2d8.ccvel.end.x = uVar72;
    local_2d8.ccvel.end.y = uVar73;
    local_2d8.domain_ilo = iVar178;
    local_2d8.domain_jlo = iVar180;
    local_2d8.domain_klo = iVar7;
    local_2d8.domain_ihi = iVar173;
    local_2d8.domain_jhi = iVar6;
    local_2d8.domain_khi = iVar8;
    local_2d8.Imz.end.y = uVar74;
    local_2d8.Ipz.end.x = uVar75;
    local_2d8.Ipz.end.y = uVar76;
    local_2d8.dtdz = dVar187;
    local_2d8.flag.end.y = uVar77;
    local_2d8.vfrac.end.y = uVar78;
    local_2d8.ccc.end.y = uVar79;
    local_2d8.fcx.end.y = uVar80;
    local_2d8.fcy.end.y = uVar81;
    local_2d8.fcz.end.y = uVar82;
    do {
      iVar178 = iVar11;
      if (iVar11 <= iVar14) {
        do {
          iVar180 = iVar10;
          if (iVar10 <= iVar13) {
            do {
              iVar173 = iVar9;
              if (iVar9 <= iVar12) {
                do {
                  PredictVelOnZFace::anon_class_680_18_41abcaaf::operator()
                            (&local_2d8,iVar173,iVar180,iVar178,iVar140);
                  iVar173 = iVar173 + 1;
                } while (iVar12 + 1 != iVar173);
              }
              bVar185 = iVar180 != iVar13;
              iVar180 = iVar180 + 1;
            } while (bVar185);
          }
          bVar185 = iVar178 != iVar14;
          iVar178 = iVar178 + 1;
        } while (bVar185);
      }
      iVar140 = iVar140 + 1;
    } while (iVar140 != 3);
  }
  return;
}

Assistant:

void
EBPLM::PredictVelOnZFace (Box const& zebox,
                          Array4<Real> const& Imz, Array4<Real> const& Ipz,
                          Array4<Real const> const& q,
                          Array4<Real const> const& ccvel,
                          Array4<EBCellFlag const> const& flag,
                          Array4<Real const> const& vfrac,
                          AMREX_D_DECL(Array4<Real const> const& fcx,
                                       Array4<Real const> const& fcy,
                                       Array4<Real const> const& fcz),
                          Array4<Real const> const& ccc,
                          Geometry& geom,
                          Real dt,
                          Vector<BCRec> const& h_bcrec,
                          BCRec const* pbc)
{
    const Real dz = geom.CellSize(2);
    const Real dtdz = dt/dz;

    int ncomp = AMREX_SPACEDIM;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::y));
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::z));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= zebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= zebox.bigEnd(0)    ) ||
         (has_extdir_or_ho_lo_z && domain_klo >= zebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= zebox.bigEnd(2)    ) ||
         (has_extdir_or_ho_lo_y && domain_jlo >= zebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= zebox.bigEnd(1)    ) )
    {
        amrex::ParallelFor(zebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                  AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imz,Ipz,dtdz,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apz(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. &&
                                           vfrac(i,j,k+1) == 1. && vfrac(i,j,k+2) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,2) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k+1) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,2) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = -0.5 - ccc(i,j,k,2);,
                                Real delta_x =  xf  - ccc(i,j,k,0);,
                                Real delta_y =  yf  - ccc(i,j,k,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);

                   qpls = q(i,j,k,n) + delta_z * slopes_eb_hi[2]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];

                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdz * ccvel(i,j,k,2) * slopes_eb_hi[2];


                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k-3) == 1. &&
                                             vfrac(i,j,k  ) == 1. && vfrac(i,j,k+1) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - ccvel(i,j,k-1,2) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k  ) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - ccvel(i,j,k-1,2) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 - ccc(i,j,k-1,2);,
                                Real delta_x = xf  - ccc(i,j,k-1,0);,
                                Real delta_y = yf  - ccc(i,j,k-1,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j,k-1,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);

                   qmns = q(i,j,k-1,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];

                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdz * ccvel(i,j,k-1,2) * slopes_eb_lo[2];

                }  // end of making qmns
            }

            Ipz(i,j,k-1,n) = qmns;
            Imz(i,j,k  ,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(zebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                          AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imz,Ipz,dtdz,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apx(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. &&
                                           vfrac(i,j,k+1) == 1. && vfrac(i,j,k+2) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,2) * dtdz) *
                        amrex_calc_zslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k+1) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,2) * dtdz) *
                        amrex_calc_zslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = -0.5 - ccc(i,j,k,2);,
                                Real delta_x =  xf  - ccc(i,j,k,0);,
                                Real delta_y =  yf  - ccc(i,j,k,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1]
                                     + delta_z * slopes_eb_hi[2];

                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdz * ccvel(i,j,k,2) * slopes_eb_hi[2];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k-1) with all values at cell centers
                if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k-3) == 1. &&
                                             vfrac(i,j,k  ) == 1. && vfrac(i,j,k+1) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - ccvel(i,j,k-1,2) * dtdz) *
                        amrex_calc_zslope(i,j,k-1,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k  ) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - ccvel(i,j,k-1,2) * dtdz) *
                        amrex_calc_zslope(i,j,k-1,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 - ccc(i,j,k-1,2);,
                                Real delta_x = xf  - ccc(i,j,k-1,0);,
                                Real delta_y = yf  - ccc(i,j,k-1,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j,k-1,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

                   qmns = q(i,j,k-1,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];

                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdz * ccvel(i,j,k-1,2) * slopes_eb_lo[2];

                }  // end of making qmns
            }

            Ipz(i,j,k-1,n) = qmns;
            Imz(i,j,k  ,n) = qpls;
        });
    }
}